

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcasestr.c
# Opt level: O3

char * nn_strcasestr(char *str,char *key)

{
  char cVar1;
  int iVar2;
  size_t len;
  
  len = strlen(key);
  cVar1 = *str;
  while( true ) {
    if (cVar1 == '\0') {
      return (char *)0x0;
    }
    iVar2 = nn_strncasecmp(str,key,len);
    if (iVar2 == 0) break;
    cVar1 = str[1];
    str = str + 1;
  }
  return str;
}

Assistant:

const char *
nn_strcasestr(const char *str, const char *key)
{
	size_t len = strlen(key);

	while (*str != '\0') {
		if (nn_strncasecmp(str, key, len) == 0) {
			return str;
		}
		str++;
	}
	return (NULL);
}